

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::needs(App *this,App *app)

{
  OptionNotFound *pOVar1;
  allocator local_71;
  string local_70;
  undefined1 local_4d;
  allocator local_39;
  string local_38;
  App *local_18;
  App *app_local;
  App *this_local;
  
  local_18 = app;
  app_local = this;
  if (app == (App *)0x0) {
    local_4d = 1;
    pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"nullptr passed",&local_39);
    OptionNotFound::OptionNotFound(pOVar1,&local_38);
    local_4d = 0;
    __cxa_throw(pOVar1,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  if (app == this) {
    pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"cannot self reference in needs",&local_71);
    OptionNotFound::OptionNotFound(pOVar1,&local_70);
    __cxa_throw(pOVar1,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::insert
            (&this->need_subcommands_,&local_18);
  return this;
}

Assistant:

App *needs(App *app) {
        if(app == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        if(app == this) {
            throw OptionNotFound("cannot self reference in needs");
        }
        need_subcommands_.insert(app);
        return this;
    }